

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String>::
convertTo<QString>(QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String>
                   *this)

{
  long lVar1;
  bool bVar2;
  DataPointer *this_00;
  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String>
  *in_RDI;
  long in_FS_OFFSET;
  iterator start;
  qsizetype len;
  QString *s;
  iterator d;
  type *in_stack_ffffffffffffff98;
  QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String> *p;
  Initialization in_stack_ffffffffffffffbc;
  qsizetype in_stack_ffffffffffffffc0;
  QString *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p = in_RDI;
  bVar2 = isNull(in_RDI);
  if (bVar2) {
    QString::QString((QString *)0x904a8c);
  }
  else {
    QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String>_>
    ::size(p);
    (in_RDI->a).b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->a).a.a = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->a).a.b = &DAT_aaaaaaaaaaaaaaaa;
    QString::QString(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    this_00 = QString::data_ptr((QString *)in_RDI);
    QArrayDataPointer<char16_t>::data(this_00);
    QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_char16_t>,_QString>,_QLatin1String>_>
    ::appendTo<QChar>(in_stack_ffffffffffffff98,(QChar **)0x904afe);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)p;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }